

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O2

bool __thiscall
jsoncons::
basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
::visit_bool(basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
             *this,bool value,semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  size_t *psVar1;
  pointer peVar2;
  undefined1 *s;
  size_t sStack_20;
  
  peVar2 = (this->stack_).
           super__Vector_base<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((((this->stack_).
        super__Vector_base<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
        ._M_impl.super__Vector_impl_data._M_start != peVar2) && (peVar2[-1].type_ == array)) &&
     (peVar2[-1].count_ != 0)) {
    string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::push_back(&this->sink_,0x2c);
  }
  if (value) {
    s = basic_compact_json_encoder<wchar_t,jsoncons::string_sink<std::__cxx11::wstring>,std::allocator<char>>
        ::true_constant()::k;
    sStack_20 = 4;
  }
  else {
    s = basic_compact_json_encoder<wchar_t,jsoncons::string_sink<std::__cxx11::wstring>,std::allocator<char>>
        ::false_constant()::k;
    sStack_20 = 5;
  }
  string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::append(&this->sink_,(value_type *)s,sStack_20);
  peVar2 = (this->stack_).
           super__Vector_base<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
      ._M_impl.super__Vector_impl_data._M_start != peVar2) {
    psVar1 = &peVar2[-1].count_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_bool(bool value, semantic_tag, const ser_context&, std::error_code&) final
        {
            if (!stack_.empty() && stack_.back().is_array() && stack_.back().count() > 0)
            {
                sink_.push_back(',');
            }

            if (value)
            {
                sink_.append(true_constant().data(), true_constant().size());
            }
            else
            {
                sink_.append(false_constant().data(), false_constant().size());
            }

            if (!stack_.empty())
            {
                stack_.back().increment_count();
            }
            JSONCONS_VISITOR_RETURN;
        }